

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O2

uint64_t refs_next(refs_table_t *tbl,uint64_t **_bucket,size_t end)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  
  puVar3 = *_bucket + 1;
  uVar2 = **_bucket & 0xffffffffff;
  do {
    if (puVar3 == tbl->refs_table + end) {
      *_bucket = (uint64_t *)0x0;
      return uVar2;
    }
    uVar1 = *puVar3;
    if ((uVar1 == 0) || (uVar1 == 0x7fffffffffffffff)) {
      puVar3 = puVar3 + 1;
    }
    else {
      *_bucket = puVar3;
    }
  } while ((uVar1 == 0) || (uVar1 == 0x7fffffffffffffff));
  return uVar2;
}

Assistant:

uint64_t
refs_next(refs_table_t *tbl, uint64_t **_bucket, size_t end)
{
    _Atomic(uint64_t)* bucket = (_Atomic(uint64_t)*)*_bucket;
    // assert(bucket != NULL);
    // assert(end <= tbl->refs_size);
    uint64_t result = atomic_load_explicit(bucket, memory_order_relaxed) & 0x000000ffffffffff;
    bucket++;
    while (bucket != tbl->refs_table + end) {
        uint64_t d = atomic_load_explicit(bucket, memory_order_relaxed);
        if (d != 0 && d != refs_ts) {
            *_bucket = (uint64_t*)bucket;
            return result;
        }
        bucket++;
    }
    *_bucket = NULL;
    return result;
}